

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

deInt64 vkt::SpirVAssembly::anon_unknown_5::randomInt64LogDistributed(Random *rnd)

{
  bool bVar1;
  int iVar2;
  deUint64 dVar3;
  undefined8 local_18;
  deInt64 val;
  Random *rnd_local;
  
  dVar3 = de::Random::getUint64(rnd);
  iVar2 = de::Random::getInt(rnd,1,0x3f);
  local_18 = (1L << ((byte)iVar2 & 0x3f)) - 1U & dVar3;
  bVar1 = de::Random::getBool(rnd);
  if (bVar1) {
    local_18 = -local_18;
  }
  return local_18;
}

Assistant:

deInt64 randomInt64LogDistributed (de::Random& rnd)
{
	deInt64 val = rnd.getUint64();
	val &= (1ull << rnd.getInt(1, 63)) - 1;
	if (rnd.getBool())
		val = -val;
	return val;
}